

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O3

void NES_FDS_Reset(void *chip)

{
  NES_FDS *fds;
  uint uVar1;
  
  *(undefined1 *)((long)chip + 0x2d) = 0;
  uVar1 = 0;
  *(undefined4 *)((long)chip + 0x274) = 0;
  memset((void *)((long)chip + 0x30),0,0x208);
  *(undefined8 *)((long)chip + 0x238) = 0;
  *(undefined8 *)((long)chip + 0x240) = 0;
  *(undefined1 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x24b) = 1;
  *(undefined4 *)((long)chip + 0x254) = 0x1010000;
  *(undefined1 *)((long)chip + 0x2c) = 1;
  *(undefined4 *)((long)chip + 0x270) = 0xff;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  *(undefined2 *)((long)chip + 0x249) = 1;
  *(undefined4 *)((long)chip + 0x244) = 0;
  *(undefined8 *)((long)chip + 600) = 0;
  *(undefined8 *)((long)chip + 0x260) = 0;
  *(undefined8 *)((long)chip + 0x268) = 0;
  *(undefined8 *)((long)chip + 0x24c) = 0;
  if (*(int *)((long)chip + 0x24) == 0) {
    uVar1 = *(uint *)((long)chip + 0x240) & 0x3f0000;
  }
  *(undefined4 *)((long)chip + 0x238) = 0;
  *(undefined1 *)((long)chip + 0x24b) = 1;
  *(uint *)((long)chip + 0x240) = uVar1;
  *(undefined1 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x2d) = 0;
  *(undefined8 *)((long)chip + 0x288) = 0;
  return;
}

Assistant:

void NES_FDS_Reset(void* chip)
{
	NES_FDS* fds = (NES_FDS*)chip;
	int i;

	fds->master_io = true;
	fds->master_vol = 0;
	fds->last_freq = 0;
	fds->last_vol = 0;

	fds->rc_accum = 0;

	for (i=0; i<2; ++i)
	{
		memset(fds->wave[i], 0, sizeof(fds->wave[i]));
		fds->freq[i] = 0;
		fds->phase[i] = 0;
	}
	fds->wav_write = false;
	fds->wav_halt = true;
	fds->env_halt = true;
	fds->mod_halt = true;
	fds->mod_pos = 0;
	fds->mod_write_pos = 0;

	for (i=0; i<2; ++i)
	{
		fds->env_mode[i] = false;
		fds->env_disable[i] = true;
		fds->env_timer[i] = 0;
		fds->env_speed[i] = 0;
		fds->env_out[i] = 0;
	}
	fds->master_env_speed = 0xFF;

	// NOTE: the FDS BIOS reset only does the following related to audio:
	//   $4023 = $00
	//   $4023 = $83 enables master_io
	//   $4080 = $80 output volume = 0, envelope disabled
	//   $408A = $FF master envelope speed set to slowest
	NES_FDS_Write(fds, 0x4023, 0x00);
	NES_FDS_Write(fds, 0x4023, 0x83);
	NES_FDS_Write(fds, 0x4080, 0x80);
	NES_FDS_Write(fds, 0x408A, 0xFF);

	// reset other stuff
	NES_FDS_Write(fds, 0x4082, 0x00);	// wav freq 0
	NES_FDS_Write(fds, 0x4083, 0x80);	// wav disable
	NES_FDS_Write(fds, 0x4084, 0x80);	// mod strength 0
	NES_FDS_Write(fds, 0x4085, 0x00);	// mod position 0
	NES_FDS_Write(fds, 0x4086, 0x00);	// mod freq 0
	NES_FDS_Write(fds, 0x4087, 0x80);	// mod disable
	NES_FDS_Write(fds, 0x4089, 0x00);	// wav write disable, max global volume}

	RC_RESET(&fds->tick_count);
}